

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

csubstr * __thiscall c4::yml::Tree::val_tag(Tree *this,size_t node)

{
  NodeType_e NVar1;
  code *pcVar2;
  Location loc;
  bool bVar3;
  error_flags eVar4;
  NodeData *pNVar5;
  csubstr *pcVar6;
  csubstr cVar7;
  char *pcStack_20;
  
  pNVar5 = _p(this,node);
  NVar1 = (pNVar5->m_type).type;
  if (((byte)(NVar1 >> 0xb) & (NVar1 & (SEQ|MAP|VAL)) != NOTYPE) == 0) {
    eVar4 = get_error_flags();
    if ((eVar4 & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        pcVar6 = (csubstr *)(*pcVar2)();
        return pcVar6;
      }
    }
    cVar7 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    pcStack_20 = cVar7.str;
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x4bc5) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x4bc5) << 0x40,8);
    loc.name.str = pcStack_20;
    loc.name.len = cVar7.len;
    yml::error("check failed: has_val_tag(node)",0x1f,loc);
  }
  pNVar5 = _p(this,node);
  return &(pNVar5->m_val).tag;
}

Assistant:

csubstr    const& val_tag   (size_t node) const { RYML_ASSERT(has_val_tag(node)); return _p(node)->m_val.tag; }